

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::
back_propagate_error
          (add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void> *this,
          tensor *x,tensor *gradient_input,zero_gradients zero_grads)

{
  bool bVar1;
  char in_CL;
  tensor *in_RSI;
  add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void> *in_RDI;
  subnet_wrapper wsub;
  undefined4 in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  resizable_tensor *in_stack_ffffffffffffffb0;
  tensor *gradient_input_00;
  tensor *ptVar2;
  tensor *in_stack_ffffffffffffffc8;
  resizable_tensor *in_stack_ffffffffffffffd0;
  
  bVar1 = have_same_dimensions(&in_stack_ffffffffffffffd0->super_tensor,in_stack_ffffffffffffffc8);
  if (!bVar1) {
    resizable_tensor::copy_size(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  resizable_tensor::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  subnet_wrapper::subnet_wrapper
            ((subnet_wrapper *)&stack0xffffffffffffffc8,in_RSI,&in_RDI->grad_final,
             in_RDI->_sample_expansion_factor);
  gradient_input_00 = &(in_RDI->params_grad).super_tensor;
  con_<64L,_7L,_7L,_2,_2,_0,_0>::get_layer_params(&in_RDI->details);
  resizable_tensor::copy_size(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ptVar2 = (tensor *)&in_RDI->details;
  private_get_output(in_RDI);
  impl::
  call_layer_backward<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>::subnet_wrapper>
            ((con_<64L,_7L,_7L,_2,_2,_0,_0> *)in_RDI,ptVar2,gradient_input_00,
             (subnet_wrapper *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (tensor *)0x20d039);
  in_RDI->gradient_input_is_stale = in_CL == '\x01';
  return;
}

Assistant:

void back_propagate_error(
            const tensor& x,
            const tensor& gradient_input,
            zero_gradients zero_grads = zero_gradients::yes
        )
        {
            // make sure grad_final is initialized to 0
            if (!have_same_dimensions(x, grad_final))
                grad_final.copy_size(x);
            grad_final = 0;  

            subnet_wrapper wsub(x, grad_final, _sample_expansion_factor);
            params_grad.copy_size(details.get_layer_params());
            impl::call_layer_backward(details, private_get_output(),
                gradient_input, wsub, static_cast<tensor&>(params_grad));

            // zero out get_gradient_input()
            gradient_input_is_stale = zero_grads == zero_gradients::yes;
        }